

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O0

void matras_destroy(matras *m)

{
  matras_id_t mVar1;
  matras_id_t mVar2;
  uint uVar3;
  void *ext;
  void *ext_00;
  bool bVar4;
  void **extent3;
  void **extent2;
  void **extent1;
  matras_view *v;
  int local_28;
  matras_id_t ptrs_in_ext;
  matras_id_t j2;
  matras_id_t i2;
  matras_id_t j1;
  matras_id_t i1;
  matras_id_t step2;
  matras_id_t step1;
  matras *m_local;
  
  while ((m->head).prev_view != (matras_view *)0x0) {
    matras_destroy_read_view(m,(m->head).prev_view);
  }
  if ((m->head).block_count != 0) {
    mVar1 = m->mask1;
    mVar2 = m->mask2;
    i2 = 0;
    j2 = 0;
    uVar3 = m->extent_size;
    ext = (m->head).root;
    for (; (ulong)j2 < (m->head).block_count; j2 = mVar1 + 1 + j2) {
      ext_00 = *(void **)((long)ext + (ulong)i2 * 8);
      local_28 = 0;
      ptrs_in_ext = 0;
      while( true ) {
        bVar4 = false;
        if (ptrs_in_ext < uVar3 >> 3) {
          bVar4 = (ulong)(j2 + local_28) < (m->head).block_count;
        }
        if (!bVar4) break;
        matras_free_extent(m,*(void **)((long)ext_00 + (ulong)ptrs_in_ext * 8));
        ptrs_in_ext = ptrs_in_ext + 1;
        local_28 = mVar2 + 1 + local_28;
      }
      matras_free_extent(m,ext_00);
      i2 = i2 + 1;
    }
    matras_free_extent(m,ext);
    if (m->extent_count != 0) {
      __assert_fail("m->extent_count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                    ,0xa7,"void matras_destroy(struct matras *)");
    }
  }
  return;
}

Assistant:

void
matras_destroy(struct matras *m)
{
	while (m->head.prev_view)
		matras_destroy_read_view(m, m->head.prev_view);
	if (m->head.block_count == 0)
		return;

	matras_id_t step1 = m->mask1 + 1;
	matras_id_t step2 = m->mask2 + 1;
	matras_id_t i1 = 0, j1 = 0, i2, j2;
	matras_id_t ptrs_in_ext = m->extent_size / (matras_id_t)sizeof(void *);
	struct matras_view *v = &m->head;
	void **extent1 = (void **)v->root;
	for (; j1 < v->block_count; i1++, j1 += step1) {
		void **extent2 = (void **)extent1[i1];
		for (i2 = j2 = 0;
		     i2 < ptrs_in_ext && j1 + j2 < v->block_count;
		     i2++, j2 += step2) {
			void **extent3 = (void **)extent2[i2];
			matras_free_extent(m, extent3);
		}
		matras_free_extent(m, extent2);
	}
	matras_free_extent(m, extent1);

	assert(m->extent_count == 0);
}